

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_interface.cpp
# Opt level: O2

bool __thiscall
cppcms::cache_interface::fetch(cache_interface *this,string *key,string *result,bool notriggers)

{
  _Rb_tree_header *p_Var1;
  base_cache *pbVar2;
  char cVar3;
  int iVar4;
  _Rb_tree_node_base *p_Var5;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  new_trig;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  
  pbVar2 = (this->cache_module_).p_;
  if (pbVar2 == (base_cache *)0x0) {
    cVar3 = '\0';
  }
  else {
    p_Var1 = &local_50._M_impl.super__Rb_tree_header;
    local_50._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_50._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_50._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_50._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    iVar4 = (**pbVar2->_vptr_base_cache)();
    cVar3 = (char)iVar4;
    p_Var5 = local_50._M_impl.super__Rb_tree_header._M_header._M_left;
    if (cVar3 == '\x01' && !notriggers) {
      for (; (_Rb_tree_header *)p_Var5 != p_Var1;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        add_trigger(this,(string *)(p_Var5 + 1));
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_50);
  }
  return (bool)cVar3;
}

Assistant:

bool cache_interface::fetch(string const &key,string &result,bool notriggers)
{
	if(nocache()) return false;
	set<string> new_trig;

	if(cache_module_->fetch(key,result, (notriggers ? 0 : &new_trig))) {
		if(!notriggers) {
			std::set<std::string>::const_iterator p;
			for(p=new_trig.begin();p!=new_trig.end();++p)
				add_trigger(*p);
		}
		return true;
	}
	return false;
}